

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BankAccount.cpp
# Opt level: O3

void __thiscall L13_2::BankAccount::withdraw(BankAccount *this,double amount)

{
  ostream *poVar1;
  
  if (amount < 0.0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Withdraw failed. negative value(",0x20);
    poVar1 = std::ostream::_M_insert<double>(amount);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,") not allowed.\n",0xf);
    return;
  }
  if (this->_balance < amount) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Withdraw failed. not enough remaining balance.\n",0x2f);
    return;
  }
  this->_balance = this->_balance - amount;
  return;
}

Assistant:

void BankAccount::withdraw(double amount) {
        if (amount < 0) {
            cout << "Withdraw failed. negative value(" << amount << ") not allowed.\n";
            return;
        }
        if (amount > _balance) {
            cout << "Withdraw failed. not enough remaining balance.\n";
            return;
        }
        _balance -= amount;
    }